

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O1

bool QtPrivate::intersect_path
               (QGraphicsItem *item,QRectF *exposeRect,ItemSelectionMode mode,
               QTransform *deviceTransform,void *intersectData)

{
  QGraphicsItemPrivate *pQVar1;
  char cVar2;
  long lVar3;
  qreal *pqVar4;
  QTransform *pQVar5;
  QRectF *path;
  long in_FS_OFFSET;
  byte bVar6;
  QPainterPath itemPath;
  QPainterPath scenePath;
  QPainterPath itemPath_1;
  QTransform transform;
  QRectF local_160;
  double dStack_140;
  undefined1 local_130 [8];
  QRectF local_128 [2];
  QTransform local_d8;
  QTransform local_88;
  long local_38;
  
  bVar6 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_130 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)local_130,(QPainterPath *)intersectData);
  local_160.h = -NAN;
  dStack_140 = -NAN;
  local_160.yp = -NAN;
  local_160.w = -NAN;
  (*item->_vptr_QGraphicsItem[3])(&local_160.yp,item);
  if ((local_160.h == 0.0) && (!NAN(local_160.h))) {
    local_160.yp = local_160.yp + -1e-05;
    local_160.w = local_160.w + 0.0;
    local_160.h = local_160.h + 2e-05;
    dStack_140 = dStack_140 + 0.0;
  }
  if ((dStack_140 == 0.0) && (!NAN(dStack_140))) {
    local_160.yp = local_160.yp + 0.0;
    local_160.w = local_160.w + -1e-05;
    local_160.h = local_160.h + 0.0;
    dStack_140 = dStack_140 + 2e-05;
  }
  pQVar1 = (item->d_ptr).d;
  if ((*(ulong *)&pQVar1->field_0x160 & 0x2000040000) == 0) {
    local_d8.m_matrix[0][2] = -NAN;
    local_d8.m_matrix[1][0] = -NAN;
    local_d8.m_matrix[0][0] = -NAN;
    local_d8.m_matrix[0][1] = -NAN;
    if ((*(ulong *)&pQVar1->field_0x160 >> 0x3e & 1) == 0) {
      QTransform::mapRect((QRectF *)&local_d8);
    }
    else {
      local_d8.m_matrix[0][0] = (pQVar1->sceneTransform).m_matrix[2][0] + local_160.yp;
      local_d8.m_matrix[0][1] = (pQVar1->sceneTransform).m_matrix[2][1] + local_160.w;
      local_d8.m_matrix[0][2] = local_160.h;
      local_d8.m_matrix[1][0] = dStack_140;
    }
    if ((mode & ~ContainsItemBoundingRect) == ContainsItemShape) {
      cVar2 = QPainterPath::contains((QRectF *)local_130);
    }
    else {
      cVar2 = QPainterPath::intersects((QRectF *)local_130);
    }
    if (cVar2 != '\x01' || IntersectsItemShape < mode) goto LAB_0063813e;
    local_128[0].xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    if ((*(ulong *)&pQVar1->field_0x160 & 0x4000000000000000) == 0) {
      QTransform::inverted((bool *)&local_88);
      QTransform::map((QPainterPath *)(local_130 + 8));
    }
    else {
      QPainterPath::translated
                (-(pQVar1->sceneTransform).m_matrix[2][0],-(pQVar1->sceneTransform).m_matrix[2][1]);
    }
    path = (QRectF *)(local_130 + 8);
    cVar2 = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item,(QPainterPath *)path,mode);
  }
  else {
    pqVar4 = (qreal *)&DAT_00703bb0;
    pQVar5 = &local_88;
    for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pQVar5->m_matrix[0][0] = *pqVar4;
      pqVar4 = pqVar4 + (ulong)bVar6 * -2 + 1;
      pQVar5 = (QTransform *)((long)pQVar5 + ((ulong)bVar6 * -2 + 1) * 8);
    }
    QGraphicsItem::deviceTransform(&local_88,item,deviceTransform);
    local_160.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    QTransform::inverted((bool *)(local_130 + 8));
    QTransform::operator*(&local_d8,deviceTransform);
    QTransform::map((QPainterPath *)&local_160);
    if ((mode & ~ContainsItemBoundingRect) == ContainsItemShape) {
      cVar2 = QPainterPath::contains(&local_160);
    }
    else {
      cVar2 = QPainterPath::intersects(&local_160);
    }
    if (cVar2 == '\x01' && mode < ContainsItemBoundingRect) {
      cVar2 = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item,(QPainterPath *)&local_160,mode)
      ;
    }
    path = &local_160;
  }
  QPainterPath::~QPainterPath((QPainterPath *)path);
LAB_0063813e:
  QPainterPath::~QPainterPath((QPainterPath *)local_130);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)cVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool intersect_path(const QGraphicsItem *item, const QRectF &exposeRect, Qt::ItemSelectionMode mode,
                               const QTransform &deviceTransform, const void *intersectData)
    {
        const QPainterPath scenePath = *static_cast<const QPainterPath *>(intersectData);

        QRectF brect = item->boundingRect();
        _q_adjustRect(&brect);

        // ### Add test for this (without making things slower?)
        Q_UNUSED(exposeRect);

        bool keep = true;
        const QGraphicsItemPrivate *itemd = QGraphicsItemPrivate::get(item);
        if (itemd->itemIsUntransformable()) {
            // Untransformable items; map the scene rect to item coordinates.
            const QTransform transform = item->deviceTransform(deviceTransform);
            QPainterPath itemPath = (deviceTransform * transform.inverted()).map(scenePath);
            if (mode == Qt::ContainsItemShape || mode == Qt::ContainsItemBoundingRect)
                keep = itemPath.contains(brect);
            else
                keep = itemPath.intersects(brect);
            if (keep && (mode == Qt::ContainsItemShape || mode == Qt::IntersectsItemShape))
                keep = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item, itemPath, mode);
        } else {
            Q_ASSERT(!itemd->dirtySceneTransform);
            const QRectF itemSceneBoundingRect = itemd->sceneTransformTranslateOnly
                                               ? brect.translated(itemd->sceneTransform.dx(),
                                                                  itemd->sceneTransform.dy())
                                               : itemd->sceneTransform.mapRect(brect);
            if (mode == Qt::ContainsItemShape || mode == Qt::ContainsItemBoundingRect)
                keep = scenePath.contains(itemSceneBoundingRect);
            else
                keep = scenePath.intersects(itemSceneBoundingRect);
            if (keep && (mode == Qt::ContainsItemShape || mode == Qt::IntersectsItemShape)) {
                QPainterPath itemPath = itemd->sceneTransformTranslateOnly
                                      ? scenePath.translated(-itemd->sceneTransform.dx(),
                                                             -itemd->sceneTransform.dy())
                                      : itemd->sceneTransform.inverted().map(scenePath);
                keep = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item, itemPath, mode);
            }
        }
        return keep;
    }